

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void log_incoming_frame(AMQP_VALUE performative)

{
  AMQP_VALUE descriptor;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  LOGGER_LOG l;
  
  descriptor = amqpvalue_get_inplace_descriptor(performative);
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (descriptor == (AMQP_VALUE)0x0) {
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                 ,"log_incoming_frame",0xdc,1,"Error getting performative descriptor");
      return;
    }
  }
  else {
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_TRACE,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                 ,"log_incoming_frame",0xe1,0,"<- ");
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar1 = get_frame_type_as_string(descriptor);
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_TRACE,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                 ,"log_incoming_frame",0xe2,0,"%s",pcVar1);
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      pcVar1 = amqpvalue_to_string(performative);
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_TRACE,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                 ,"log_incoming_frame",0xe4,1,"%s",pcVar1);
      if (pcVar1 != (char *)0x0) {
        free(pcVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void log_incoming_frame(AMQP_VALUE performative)
{
#ifdef NO_LOGGING
    UNUSED(performative);
#else
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);
    if (descriptor == NULL)
    {
        LogError("Error getting performative descriptor");
    }
    else
    {
        char* performative_as_string;
        LOG(AZ_LOG_TRACE, 0, "<- ");
        LOG(AZ_LOG_TRACE, 0, "%s", (char*)get_frame_type_as_string(descriptor));
        performative_as_string = NULL;
        LOG(AZ_LOG_TRACE, LOG_LINE, "%s", (performative_as_string = amqpvalue_to_string(performative)));
        if (performative_as_string != NULL)
        {
            free(performative_as_string);
        }
    }
#endif
}